

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ttload.c
# Opt level: O2

FT_Error tt_face_load_name(TT_Face face,FT_Stream stream)

{
  TT_NameTableRec *structure;
  FT_Memory memory;
  TT_NameRec *block;
  FT_UShort FVar1;
  FT_Error FVar2;
  uint uVar3;
  FT_ULong FVar4;
  TT_LangTagRec *pTVar5;
  ulong uVar6;
  TT_NameRec *pTVar7;
  FT_UInt FVar8;
  bool bVar9;
  FT_ULong local_68;
  FT_ULong table_len;
  ulong local_58;
  TT_LangTagRec *local_50;
  ulong local_48;
  FT_ULong local_40;
  FT_Error local_34;
  
  memory = stream->memory;
  (face->name_table).stream = stream;
  local_34 = (*face->goto_table)(face,0x6e616d65,stream,&local_68);
  if (local_34 == 0) {
    structure = &face->name_table;
    FVar4 = FT_Stream_Pos(stream);
    FVar2 = FT_Stream_ReadFields(stream,tt_face_load_name::name_table_fields,structure);
    local_34 = FVar2;
    if (FVar2 == 0) {
      uVar3 = (face->name_table).numNameRecords;
      local_48 = uVar3 * 0xc + FVar4 + 6;
      local_58 = local_68 + FVar4;
      local_34 = 0x91;
      if (local_48 <= local_58) {
        local_40 = FVar4;
        local_34 = FVar2;
        if (structure->format == 1) {
          local_34 = FT_Stream_Seek(stream,local_48);
          if (local_34 != 0) {
            return local_34;
          }
          FVar1 = FT_Stream_ReadUShort(stream,&local_34);
          uVar3 = (uint)FVar1;
          (face->name_table).numLangTagRecords = uVar3;
          if (local_34 != 0) {
            return local_34;
          }
          pTVar5 = (TT_LangTagRec *)ft_mem_realloc(memory,0x18,0,(ulong)uVar3,(void *)0x0,&local_34)
          ;
          (face->name_table).langTags = pTVar5;
          if (local_34 != 0) {
            return local_34;
          }
          FVar2 = FT_Stream_EnterFrame(stream,(ulong)((face->name_table).numLangTagRecords << 2));
          if (FVar2 != 0) {
            return FVar2;
          }
          table_len = local_40 + 6;
          local_48 = local_48 + (ulong)uVar3 * 4 + 2;
          pTVar5 = (face->name_table).langTags;
          local_50 = pTVar5 + (face->name_table).numLangTagRecords;
          local_34 = 0;
          for (; pTVar5 < local_50; pTVar5 = pTVar5 + 1) {
            local_34 = FT_Stream_ReadFields(stream,tt_face_load_name::langTag_record_fields,pTVar5);
            uVar6 = (face->name_table).storageOffset + local_40 + pTVar5->stringOffset;
            pTVar5->stringOffset = uVar6;
            if ((uVar6 < local_48) || (local_58 < uVar6 + pTVar5->stringLength)) {
              pTVar5->stringLength = 0;
            }
          }
          FT_Stream_ExitFrame(stream);
          local_34 = FT_Stream_Seek(stream,table_len);
          uVar3 = (face->name_table).numNameRecords;
        }
        pTVar7 = (TT_NameRec *)ft_mem_realloc(memory,0x20,0,(ulong)uVar3,(void *)0x0,&local_34);
        FVar4 = local_40;
        (face->name_table).names = pTVar7;
        if ((local_34 == 0) &&
           (local_34 = FT_Stream_EnterFrame(stream,(ulong)((face->name_table).numNameRecords * 0xc))
           , local_34 == 0)) {
          pTVar7 = (face->name_table).names;
          FVar8 = (face->name_table).numNameRecords;
          local_50 = (TT_LangTagRec *)structure;
          local_40 = FVar4;
          while (bVar9 = FVar8 != 0, FVar8 = FVar8 - 1, bVar9) {
            local_34 = FT_Stream_ReadFields(stream,tt_face_load_name::name_record_fields,pTVar7);
            if ((local_34 == 0) && ((ulong)pTVar7->stringLength != 0)) {
              uVar6 = (face->name_table).storageOffset + local_40 + pTVar7->stringOffset;
              pTVar7->stringOffset = uVar6;
              if (((local_48 <= uVar6) && (uVar6 + pTVar7->stringLength <= local_58)) &&
                 (((local_50->stringLength != 1 || (-1 < (short)pTVar7->languageID)) ||
                  ((uVar3 = pTVar7->languageID - 0x8000,
                   uVar3 < (face->name_table).numLangTagRecords &&
                   ((face->name_table).langTags[uVar3].stringLength != 0)))))) {
                pTVar7 = pTVar7 + 1;
              }
            }
          }
          block = (face->name_table).names;
          uVar6 = (ulong)((long)pTVar7 - (long)block) >> 5;
          pTVar7 = (TT_NameRec *)
                   ft_mem_realloc(memory,0x20,(ulong)(face->name_table).numNameRecords,
                                  uVar6 & 0xffffffff,block,&local_34);
          (face->name_table).names = pTVar7;
          (face->name_table).numNameRecords = (FT_UInt)uVar6;
          FT_Stream_ExitFrame(stream);
          face->num_names = (FT_UShort)(face->name_table).numNameRecords;
        }
      }
    }
  }
  return local_34;
}

Assistant:

FT_LOCAL_DEF( FT_Error )
  tt_face_load_name( TT_Face    face,
                     FT_Stream  stream )
  {
    FT_Error      error;
    FT_Memory     memory = stream->memory;
    FT_ULong      table_pos, table_len;
    FT_ULong      storage_start, storage_limit;
    TT_NameTable  table;

    static const FT_Frame_Field  name_table_fields[] =
    {
#undef  FT_STRUCTURE
#define FT_STRUCTURE  TT_NameTableRec

      FT_FRAME_START( 6 ),
        FT_FRAME_USHORT( format ),
        FT_FRAME_USHORT( numNameRecords ),
        FT_FRAME_USHORT( storageOffset ),
      FT_FRAME_END
    };

    static const FT_Frame_Field  name_record_fields[] =
    {
#undef  FT_STRUCTURE
#define FT_STRUCTURE  TT_NameRec

      /* no FT_FRAME_START */
        FT_FRAME_USHORT( platformID ),
        FT_FRAME_USHORT( encodingID ),
        FT_FRAME_USHORT( languageID ),
        FT_FRAME_USHORT( nameID ),
        FT_FRAME_USHORT( stringLength ),
        FT_FRAME_USHORT( stringOffset ),
      FT_FRAME_END
    };

    static const FT_Frame_Field  langTag_record_fields[] =
    {
#undef  FT_STRUCTURE
#define FT_STRUCTURE  TT_LangTagRec

      /* no FT_FRAME_START */
        FT_FRAME_USHORT( stringLength ),
        FT_FRAME_USHORT( stringOffset ),
      FT_FRAME_END
    };


    table         = &face->name_table;
    table->stream = stream;

    error = face->goto_table( face, TTAG_name, stream, &table_len );
    if ( error )
      goto Exit;

    table_pos = FT_STREAM_POS();

    if ( FT_STREAM_READ_FIELDS( name_table_fields, table ) )
      goto Exit;

    /* Some popular Asian fonts have an invalid `storageOffset' value (it */
    /* should be at least `6 + 12*numNameRecords').  However, the string  */
    /* offsets, computed as `storageOffset + entry->stringOffset', are    */
    /* valid pointers within the name table...                            */
    /*                                                                    */
    /* We thus can't check `storageOffset' right now.                     */
    /*                                                                    */
    storage_start = table_pos + 6 + 12 * table->numNameRecords;
    storage_limit = table_pos + table_len;

    if ( storage_start > storage_limit )
    {
      FT_ERROR(( "tt_face_load_name: invalid `name' table\n" ));
      error = FT_THROW( Name_Table_Missing );
      goto Exit;
    }

    /* `name' format 1 contains additional language tag records, */
    /* which we load first                                       */
    if ( table->format == 1 )
    {
      if ( FT_STREAM_SEEK( storage_start )            ||
           FT_READ_USHORT( table->numLangTagRecords ) )
        goto Exit;

      storage_start += 2 + 4 * table->numLangTagRecords;

      /* allocate language tag records array */
      if ( FT_NEW_ARRAY( table->langTags, table->numLangTagRecords ) ||
           FT_FRAME_ENTER( table->numLangTagRecords * 4 )            )
        goto Exit;

      /* load language tags */
      {
        TT_LangTag  entry = table->langTags;
        TT_LangTag  limit = entry + table->numLangTagRecords;


        for ( ; entry < limit; entry++ )
        {
          (void)FT_STREAM_READ_FIELDS( langTag_record_fields, entry );

          /* check that the langTag string is within the table */
          entry->stringOffset += table_pos + table->storageOffset;
          if ( entry->stringOffset                       < storage_start ||
               entry->stringOffset + entry->stringLength > storage_limit )
          {
            /* invalid entry; ignore it */
            entry->stringLength = 0;
          }
        }
      }

      FT_FRAME_EXIT();

      (void)FT_STREAM_SEEK( table_pos + 6 );
    }

    /* allocate name records array */
    if ( FT_NEW_ARRAY( table->names, table->numNameRecords ) ||
         FT_FRAME_ENTER( table->numNameRecords * 12 )        )
      goto Exit;

    /* load name records */
    {
      TT_Name  entry = table->names;
      FT_UInt  count = table->numNameRecords;


      for ( ; count > 0; count-- )
      {
        if ( FT_STREAM_READ_FIELDS( name_record_fields, entry ) )
          continue;

        /* check that the name is not empty */
        if ( entry->stringLength == 0 )
          continue;

        /* check that the name string is within the table */
        entry->stringOffset += table_pos + table->storageOffset;
        if ( entry->stringOffset                       < storage_start ||
             entry->stringOffset + entry->stringLength > storage_limit )
        {
          /* invalid entry; ignore it */
          continue;
        }

        /* assure that we have a valid language tag ID, and   */
        /* that the corresponding langTag entry is valid, too */
        if ( table->format == 1 && entry->languageID >= 0x8000U )
        {
          if ( entry->languageID - 0x8000U >= table->numLangTagRecords    ||
               !table->langTags[entry->languageID - 0x8000U].stringLength )
          {
            /* invalid entry; ignore it */
            continue;
          }
        }

        entry++;
      }

      /* reduce array size to the actually used elements */
      count = (FT_UInt)( entry - table->names );
      (void)FT_RENEW_ARRAY( table->names,
                            table->numNameRecords,
                            count );
      table->numNameRecords = count;
    }

    FT_FRAME_EXIT();

    /* everything went well, update face->num_names */
    face->num_names = (FT_UShort)table->numNameRecords;

  Exit:
    return error;
  }